

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

DistantLight * __thiscall tinyusdz::Prim::as<tinyusdz::DistantLight>(Prim *this)

{
  DistantLight *pDVar1;
  
  pDVar1 = tinyusdz::value::Value::as<tinyusdz::DistantLight>(&this->_data,false);
  return pDVar1;
}

Assistant:

const T *as() const {
    // Check if T is Prim type. e.g. Xform, Material, ...
    if ((value::TypeId::TYPE_ID_MODEL_BEGIN <=
         value::TypeTraits<T>::type_id()) &&
        (value::TypeId::TYPE_ID_MODEL_END > value::TypeTraits<T>::type_id())) {
      return _data.as<T>();
    }

    return nullptr;
  }